

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim.c
# Opt level: O0

object * primitive(int primitiveNumber,object *args,int *failed)

{
  ulong uVar1;
  uintptr_t uVar2;
  char *pcVar3;
  size_t sVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint *puVar9;
  FILE *pFVar10;
  char *pcVar11;
  char *pcVar12;
  int64_t val;
  size_t sVar13;
  object *poVar14;
  ulong uVar15;
  int *piVar16;
  ssize_t sVar17;
  long lVar18;
  char *pcVar19;
  char *pcVar20;
  char *pcVar21;
  char *pcVar22;
  char *pcVar23;
  char *pcVar24;
  char *pcVar25;
  char *pcVar26;
  char *pcVar27;
  char *pcVar28;
  char *pcVar29;
  char acStack_160 [12];
  uint local_154;
  ulong local_150;
  object *local_148;
  undefined1 local_139;
  ulong local_138;
  int local_130;
  int local_12c;
  int i_1;
  int str_len;
  char *argv_str;
  object *argv_entry;
  object *poStack_110;
  int index;
  object *argv_array;
  byteObject *msg;
  char *r;
  char *q;
  char *p_1;
  char *cmdBuf;
  size_t cmdBufSize;
  size_t tmpFileNameSize;
  char *tmpFileName;
  char *modeBuffer;
  char *pcStack_b8;
  int modeSize;
  char *pathBuffer;
  int pathSize;
  byteObject *ba;
  undefined4 local_98;
  int port;
  int sock_opt;
  int sock;
  socklen_t myAddrSize;
  in_addr iaddr;
  sockaddr_in sin;
  sockaddr myAddr;
  char netBuffer [18];
  int subPrim;
  byteObject *stringReturn;
  uint8_t *p;
  FILE *fp;
  int local_30;
  int rc;
  int j;
  int i;
  object *returnedValue;
  int *failed_local;
  object *args_local;
  int primitiveNumber_local;
  
  poVar14 = nilObject;
  _j = nilObject;
  *failed = 0;
  local_138 = (ulong)(primitiveNumber - 100);
  switch(local_138) {
  case 0:
    iVar6 = (*(uint *)args[1].header >> 2) + 1;
    pcVar12 = acStack_160 + (8 - ((long)iVar6 + 0xfU & 0xfffffffffffffff0));
    modeBuffer._4_4_ = ((uint)(args[1].class)->header >> 2) + 1;
    pcVar11 = pcVar12 + -((long)modeBuffer._4_4_ + 0xfU & 0xfffffffffffffff0);
    poVar14 = (object *)args[1].header;
    tmpFileName = pcVar11;
    pcStack_b8 = pcVar12;
    pathBuffer._4_4_ = iVar6;
    pcVar11[-8] = -10;
    pcVar11[-7] = -0x23;
    pcVar11[-6] = '\x10';
    pcVar11[-5] = '\0';
    pcVar11[-4] = '\0';
    pcVar11[-3] = '\0';
    pcVar11[-2] = '\0';
    pcVar11[-1] = '\0';
    getUnixString(pcVar12,iVar6,poVar14);
    iVar6 = modeBuffer._4_4_;
    pcVar12 = tmpFileName;
    poVar14 = args[1].class;
    pcVar11[-8] = '\x10';
    pcVar11[-7] = -0x22;
    pcVar11[-6] = '\x10';
    pcVar11[-5] = '\0';
    pcVar11[-4] = '\0';
    pcVar11[-3] = '\0';
    pcVar11[-2] = '\0';
    pcVar11[-1] = '\0';
    getUnixString(pcVar12,iVar6,poVar14);
    pcVar3 = pcStack_b8;
    pcVar12 = tmpFileName;
    pcVar11[-8] = '#';
    pcVar11[-7] = -0x22;
    pcVar11[-6] = '\x10';
    pcVar11[-5] = '\0';
    pcVar11[-4] = '\0';
    pcVar11[-3] = '\0';
    pcVar11[-2] = '\0';
    pcVar11[-1] = '\0';
    pFVar10 = fopen(pcVar3,pcVar12);
    if (pFVar10 == (FILE *)0x0) {
      *failed = 1;
    }
    else {
      for (rc = 0; (rc < 200 && (filePointers[rc] != (FILE *)0x0)); rc = rc + 1) {
      }
      if (rc < 200) {
        _j = (object *)((long)rc << 1 | 1);
        filePointers[rc] = (FILE *)pFVar10;
      }
      else {
        pcVar11[-8] = -0x7e;
        pcVar11[-7] = -0x22;
        pcVar11[-6] = '\x10';
        pcVar11[-5] = '\0';
        pcVar11[-4] = '\0';
        pcVar11[-3] = '\0';
        pcVar11[-2] = '\0';
        pcVar11[-1] = '\0';
        error_impl("primitive",0x61,"too many open files");
      }
    }
    break;
  case 1:
    iVar6 = (int)((long)args[1].header >> 1);
    if (((iVar6 < 0) || (199 < iVar6)) || ((FILE *)filePointers[iVar6] == (FILE *)0x0)) {
      *failed = 1;
    }
    else {
      acStack_160[0] = '\x05';
      acStack_160[1] = -0x21;
      acStack_160[2] = '\x10';
      acStack_160[3] = '\0';
      acStack_160[4] = '\0';
      acStack_160[5] = '\0';
      acStack_160[6] = '\0';
      acStack_160[7] = '\0';
      iVar6 = fgetc((FILE *)filePointers[iVar6]);
      if (iVar6 != -1) {
        _j = (object *)((long)iVar6 << 1 | 1);
      }
    }
    break;
  case 2:
    iVar6 = (int)((long)args[1].header >> 1);
    if (((iVar6 < 0) || (199 < iVar6)) || ((FILE *)filePointers[iVar6] == (FILE *)0x0)) {
      *failed = 1;
    }
    else {
      acStack_160[0] = '}';
      acStack_160[1] = -0x21;
      acStack_160[2] = '\x10';
      acStack_160[3] = '\0';
      acStack_160[4] = '\0';
      acStack_160[5] = '\0';
      acStack_160[6] = '\0';
      acStack_160[7] = '\0';
      fputc((int)((long)args[1].class >> 1),(FILE *)filePointers[iVar6]);
    }
    break;
  case 3:
    iVar6 = (int)((long)args[1].header >> 1);
    if (((iVar6 < 0) || (199 < iVar6)) || ((FILE *)filePointers[iVar6] == (FILE *)0x0)) {
      *failed = 1;
    }
    else {
      acStack_160[0] = -0x30;
      acStack_160[1] = -0x21;
      acStack_160[2] = '\x10';
      acStack_160[3] = '\0';
      acStack_160[4] = '\0';
      acStack_160[5] = '\0';
      acStack_160[6] = '\0';
      acStack_160[7] = '\0';
      fclose((FILE *)filePointers[iVar6]);
    }
    break;
  case 4:
    iVar6 = (int)((long)args[1].header >> 1);
    if (((iVar6 < 0) || (199 < iVar6)) || (filePointers[iVar6] == (FILE *)0x0)) {
      *failed = 1;
    }
    else {
      acStack_160[0] = '#';
      acStack_160[1] = -0x20;
      acStack_160[2] = '\x10';
      acStack_160[3] = '\0';
      acStack_160[4] = '\0';
      acStack_160[5] = '\0';
      acStack_160[6] = '\0';
      acStack_160[7] = '\0';
      fileOut(filePointers[iVar6]);
    }
    break;
  case 5:
    tmpFileNameSize = 0;
    cmdBufSize = 0;
    local_139 = 0;
    acStack_160[0] = 'b';
    acStack_160[1] = -0x20;
    acStack_160[2] = '\x10';
    acStack_160[3] = '\0';
    acStack_160[4] = '\0';
    acStack_160[5] = '\0';
    acStack_160[6] = '\0';
    acStack_160[7] = '\0';
    iVar6 = snprintf((char *)0x0,0,"%s/lsteditXXXXXX",tmpdir);
    cmdBufSize = (long)iVar6 + 1;
    acStack_160[0] = -0x6b;
    acStack_160[1] = -0x20;
    acStack_160[2] = '\x10';
    acStack_160[3] = '\0';
    acStack_160[4] = '\0';
    acStack_160[5] = '\0';
    acStack_160[6] = '\0';
    acStack_160[7] = '\0';
    info_impl("primitive",0x9d,"temporary file name size is %d",cmdBufSize & 0xffffffff);
    lVar18 = -(cmdBufSize + 0x10 & 0xfffffffffffffff0);
    pcVar12 = acStack_160 + lVar18 + 8;
    sVar13 = cmdBufSize + 1;
    pcVar19 = acStack_160 + lVar18;
    tmpFileNameSize = (size_t)pcVar12;
    pcVar19[0] = -0x33;
    pcVar19[1] = -0x20;
    pcVar19[2] = '\x10';
    pcVar19[3] = '\0';
    pcVar19[4] = '\0';
    pcVar19[5] = '\0';
    pcVar19[6] = '\0';
    pcVar19[7] = '\0';
    memset(pcVar12,0,sVar13);
    sVar4 = tmpFileNameSize;
    sVar13 = cmdBufSize + 1;
    pcVar20 = acStack_160 + lVar18;
    pcVar20[0] = -0xc;
    pcVar20[1] = -0x20;
    pcVar20[2] = '\x10';
    pcVar20[3] = '\0';
    pcVar20[4] = '\0';
    pcVar20[5] = '\0';
    pcVar20[6] = '\0';
    pcVar20[7] = '\0';
    snprintf((char *)sVar4,sVar13,"%s/lsteditXXXXXX",tmpdir);
    sVar4 = tmpFileNameSize;
    pcVar21 = acStack_160 + lVar18;
    pcVar21[0] = '\x15';
    pcVar21[1] = -0x1f;
    pcVar21[2] = '\x10';
    pcVar21[3] = '\0';
    pcVar21[4] = '\0';
    pcVar21[5] = '\0';
    pcVar21[6] = '\0';
    pcVar21[7] = '\0';
    info_impl("primitive",0xa4,"DEBUG: temp file name pattern: %s",sVar4);
    sVar4 = tmpFileNameSize;
    pcVar22 = acStack_160 + lVar18;
    pcVar22[0] = '!';
    pcVar22[1] = -0x1f;
    pcVar22[2] = '\x10';
    pcVar22[3] = '\0';
    pcVar22[4] = '\0';
    pcVar22[5] = '\0';
    pcVar22[6] = '\0';
    pcVar22[7] = '\0';
    iVar6 = mkstemp((char *)sVar4);
    if (iVar6 == -1) {
      pcVar23 = acStack_160 + lVar18;
      pcVar23[0] = '/';
      pcVar23[1] = -0x1f;
      pcVar23[2] = '\x10';
      pcVar23[3] = '\0';
      pcVar23[4] = '\0';
      pcVar23[5] = '\0';
      pcVar23[6] = '\0';
      pcVar23[7] = '\0';
      puVar9 = (uint *)__errno_location();
      uVar8 = *puVar9;
      pcVar24 = acStack_160 + lVar18;
      pcVar24[0] = 'K';
      pcVar24[1] = -0x1f;
      pcVar24[2] = '\x10';
      pcVar24[3] = '\0';
      pcVar24[4] = '\0';
      pcVar24[5] = '\0';
      pcVar24[6] = '\0';
      pcVar24[7] = '\0';
      error_impl("primitive",0xa9,"error making temporary file name: errno=%d!",(ulong)uVar8);
    }
    sVar4 = tmpFileNameSize;
    pcVar25 = acStack_160 + lVar18;
    pcVar25[0] = '^';
    pcVar25[1] = -0x1f;
    pcVar25[2] = '\x10';
    pcVar25[3] = '\0';
    pcVar25[4] = '\0';
    pcVar25[5] = '\0';
    pcVar25[6] = '\0';
    pcVar25[7] = '\0';
    pFVar10 = fopen((char *)sVar4,"w");
    sVar4 = tmpFileNameSize;
    if (pFVar10 == (FILE *)0x0) {
      pcVar26 = acStack_160 + lVar18;
      pcVar26[0] = -0x76;
      pcVar26[1] = -0x1f;
      pcVar26[2] = '\x10';
      pcVar26[3] = '\0';
      pcVar26[4] = '\0';
      pcVar26[5] = '\0';
      pcVar26[6] = '\0';
      pcVar26[7] = '\0';
      error_impl("primitive",0xae,"cannot open temp edit file %s!",sVar4);
    }
    uVar15 = *(ulong *)args[1].header;
    stringReturn = (byteObject *)(args[1].header + 0x10);
    for (rc = 0; rc < (int)((uint)(uVar15 >> 2) & 0x3fffffff); rc = rc + 1) {
      uVar2 = stringReturn->header;
      pcVar27 = acStack_160 + lVar18;
      pcVar27[0] = -0x2b;
      pcVar27[1] = -0x1f;
      pcVar27[2] = '\x10';
      pcVar27[3] = '\0';
      pcVar27[4] = '\0';
      pcVar27[5] = '\0';
      pcVar27[6] = '\0';
      pcVar27[7] = '\0';
      fputc((uint)(byte)uVar2,pFVar10);
      stringReturn = (byteObject *)((long)&stringReturn->header + 1);
    }
    pcVar28 = acStack_160 + lVar18;
    pcVar28[0] = -0x12;
    pcVar28[1] = -0x1f;
    pcVar28[2] = '\x10';
    pcVar28[3] = '\0';
    pcVar28[4] = '\0';
    pcVar28[5] = '\0';
    pcVar28[6] = '\0';
    pcVar28[7] = '\0';
    fputc(10,pFVar10);
    pcVar29 = acStack_160 + lVar18;
    pcVar29[0] = -9;
    pcVar29[1] = -0x1f;
    pcVar29[2] = '\x10';
    pcVar29[3] = '\0';
    pcVar29[4] = '\0';
    pcVar29[5] = '\0';
    pcVar29[6] = '\0';
    pcVar29[7] = '\0';
    fclose(pFVar10);
    cmdBuf = (char *)(cmdBufSize + 3);
    pcVar12 = pcVar12 + -(cmdBufSize + 0x13 & 0xfffffffffffffff0);
    sVar13 = cmdBufSize + 4;
    p_1 = pcVar12;
    pcVar12[-8] = 'A';
    pcVar12[-7] = -0x1e;
    pcVar12[-6] = '\x10';
    pcVar12[-5] = '\0';
    pcVar12[-4] = '\0';
    pcVar12[-3] = '\0';
    pcVar12[-2] = '\0';
    pcVar12[-1] = '\0';
    memset(pcVar12,0,sVar13);
    pcVar3 = p_1;
    pcVar12[-8] = 'T';
    pcVar12[-7] = -0x1e;
    pcVar12[-6] = '\x10';
    pcVar12[-5] = '\0';
    pcVar12[-4] = '\0';
    pcVar12[-3] = '\0';
    pcVar12[-2] = '\0';
    pcVar12[-1] = '\0';
    strcpy(pcVar3,"vi ");
    sVar4 = tmpFileNameSize;
    pcVar3 = p_1;
    pcVar12[-8] = 'g';
    pcVar12[-7] = -0x1e;
    pcVar12[-6] = '\x10';
    pcVar12[-5] = '\0';
    pcVar12[-4] = '\0';
    pcVar12[-3] = '\0';
    pcVar12[-2] = '\0';
    pcVar12[-1] = '\0';
    strcat(pcVar3,(char *)sVar4);
    pcVar3 = p_1;
    pcVar12[-8] = 's';
    pcVar12[-7] = -0x1e;
    pcVar12[-6] = '\x10';
    pcVar12[-5] = '\0';
    pcVar12[-4] = '\0';
    pcVar12[-3] = '\0';
    pcVar12[-2] = '\0';
    pcVar12[-1] = '\0';
    iVar6 = system(pcVar3);
    if (iVar6 == -1) {
      pcVar12[-8] = -0x7f;
      pcVar12[-7] = -0x1e;
      pcVar12[-6] = '\x10';
      pcVar12[-5] = '\0';
      pcVar12[-4] = '\0';
      pcVar12[-3] = '\0';
      pcVar12[-2] = '\0';
      pcVar12[-1] = '\0';
      puVar9 = (uint *)__errno_location();
      uVar8 = *puVar9;
      pcVar12[-8] = -99;
      pcVar12[-7] = -0x1e;
      pcVar12[-6] = '\x10';
      pcVar12[-5] = '\0';
      pcVar12[-4] = '\0';
      pcVar12[-3] = '\0';
      pcVar12[-2] = '\0';
      pcVar12[-1] = '\0';
      error_impl("primitive",0xc5,"error starting editor: %d!",(ulong)uVar8);
    }
    sVar4 = tmpFileNameSize;
    pcVar12[-8] = -0x50;
    pcVar12[-7] = -0x1e;
    pcVar12[-6] = '\x10';
    pcVar12[-5] = '\0';
    pcVar12[-4] = '\0';
    pcVar12[-3] = '\0';
    pcVar12[-2] = '\0';
    pcVar12[-1] = '\0';
    pFVar10 = fopen((char *)sVar4,"r");
    sVar4 = tmpFileNameSize;
    if (pFVar10 == (FILE *)0x0) {
      pcVar12[-8] = -0x24;
      pcVar12[-7] = -0x1e;
      pcVar12[-6] = '\x10';
      pcVar12[-5] = '\0';
      pcVar12[-4] = '\0';
      pcVar12[-3] = '\0';
      pcVar12[-2] = '\0';
      pcVar12[-1] = '\0';
      error_impl("primitive",0xcb,"cannot open temp edit file %s!",sVar4);
    }
    pcVar12[-8] = -0x12;
    pcVar12[-7] = -0x1e;
    pcVar12[-6] = '\x10';
    pcVar12[-5] = '\0';
    pcVar12[-4] = '\0';
    pcVar12[-3] = '\0';
    pcVar12[-2] = '\0';
    pcVar12[-1] = '\0';
    fseek(pFVar10,0,2);
    pcVar12[-8] = -9;
    pcVar12[-7] = -0x1e;
    pcVar12[-6] = '\x10';
    pcVar12[-5] = '\0';
    pcVar12[-4] = '\0';
    pcVar12[-3] = '\0';
    pcVar12[-2] = '\0';
    pcVar12[-1] = '\0';
    lVar18 = ftell(pFVar10);
    pcVar12[-8] = '\x02';
    pcVar12[-7] = -0x1d;
    pcVar12[-6] = '\x10';
    pcVar12[-5] = '\0';
    pcVar12[-4] = '\0';
    pcVar12[-3] = '\0';
    pcVar12[-2] = '\0';
    pcVar12[-1] = '\0';
    _j = gcialloc((int)lVar18);
    _j->class = *(object **)(args[1].header + 8);
    pcVar12[-8] = '-';
    pcVar12[-7] = -0x1d;
    pcVar12[-6] = '\x10';
    pcVar12[-5] = '\0';
    pcVar12[-4] = '\0';
    pcVar12[-3] = '\0';
    pcVar12[-2] = '\0';
    pcVar12[-1] = '\0';
    fseek(pFVar10,0,0);
    for (rc = 0; rc < (int)lVar18; rc = rc + 1) {
      pcVar12[-8] = 'E';
      pcVar12[-7] = -0x1d;
      pcVar12[-6] = '\x10';
      pcVar12[-5] = '\0';
      pcVar12[-4] = '\0';
      pcVar12[-3] = '\0';
      pcVar12[-2] = '\0';
      pcVar12[-1] = '\0';
      iVar6 = fgetc(pFVar10);
      *(char *)((long)&_j[1].header + (long)rc) = (char)iVar6;
    }
    pcVar12[-8] = 'g';
    pcVar12[-7] = -0x1d;
    pcVar12[-6] = '\x10';
    pcVar12[-5] = '\0';
    pcVar12[-4] = '\0';
    pcVar12[-3] = '\0';
    pcVar12[-2] = '\0';
    pcVar12[-1] = '\0';
    fclose(pFVar10);
    sVar4 = tmpFileNameSize;
    pcVar12[-8] = 's';
    pcVar12[-7] = -0x1d;
    pcVar12[-6] = '\x10';
    pcVar12[-5] = '\0';
    pcVar12[-4] = '\0';
    pcVar12[-3] = '\0';
    pcVar12[-2] = '\0';
    pcVar12[-1] = '\0';
    unlink((char *)sVar4);
    break;
  case 6:
    iVar6 = (int)((long)args[1].header >> 1);
    if (((iVar6 < 0) || (199 < iVar6)) || ((FILE *)filePointers[iVar6] == (FILE *)0x0)) {
      *failed = 1;
    }
    else {
      _j = args[1].class;
      if ((_j->header & 2) == 0) {
        *failed = 1;
      }
      else {
        iVar5 = (int)((long)args[2].header >> 1);
        if ((iVar5 < 0) || ((int)((uint)(_j->header >> 2) & 0x3fffffff) < iVar5)) {
          *failed = 1;
        }
        else {
          acStack_160[0] = '7';
          acStack_160[1] = -0x1c;
          acStack_160[2] = '\x10';
          acStack_160[3] = '\0';
          acStack_160[4] = '\0';
          acStack_160[5] = '\0';
          acStack_160[6] = '\0';
          acStack_160[7] = '\0';
          sVar13 = fread(_j + 1,1,(long)iVar5,(FILE *)filePointers[iVar6]);
          if ((int)sVar13 < 0) {
            *failed = 1;
          }
          else {
            _j = (object *)((long)(int)sVar13 << 1 | 1);
          }
        }
      }
    }
    break;
  case 7:
    iVar6 = (int)((long)args[1].header >> 1);
    if (((iVar6 < 0) || (199 < iVar6)) || ((FILE *)filePointers[iVar6] == (FILE *)0x0)) {
      *failed = 1;
    }
    else {
      _j = args[1].class;
      if ((_j->header & 2) == 0) {
        *failed = 1;
      }
      else {
        iVar5 = (int)((long)args[2].header >> 1);
        if ((iVar5 < 0) || ((int)((uint)(_j->header >> 2) & 0x3fffffff) < iVar5)) {
          *failed = 1;
        }
        else {
          acStack_160[0] = '\"';
          acStack_160[1] = -0x1b;
          acStack_160[2] = '\x10';
          acStack_160[3] = '\0';
          acStack_160[4] = '\0';
          acStack_160[5] = '\0';
          acStack_160[6] = '\0';
          acStack_160[7] = '\0';
          sVar13 = fwrite(_j + 1,1,(long)iVar5,(FILE *)filePointers[iVar6]);
          if ((int)sVar13 < 0) {
            *failed = 1;
          }
          else {
            _j = (object *)((long)(int)sVar13 << 1 | 1);
          }
        }
      }
    }
    break;
  case 8:
    iVar6 = (int)((long)args[1].header >> 1);
    if (((iVar6 < 0) || (199 < iVar6)) || ((FILE *)filePointers[iVar6] == (FILE *)0x0)) {
      *failed = 1;
    }
    else {
      iVar5 = (int)((long)args[1].class >> 1);
      if (-1 < iVar5) {
        acStack_160[0] = -0x4a;
        acStack_160[1] = -0x1b;
        acStack_160[2] = '\x10';
        acStack_160[3] = '\0';
        acStack_160[4] = '\0';
        acStack_160[5] = '\0';
        acStack_160[6] = '\0';
        acStack_160[7] = '\0';
        iVar6 = fseek((FILE *)filePointers[iVar6],(long)iVar5,0);
        if (-1 < iVar6) {
          return (object *)((long)iVar6 << 1 | 1);
        }
      }
      *failed = 1;
    }
    break;
  default:
    acStack_160[0] = '_';
    acStack_160[1] = -0x11;
    acStack_160[2] = '\x10';
    acStack_160[3] = '\0';
    acStack_160[4] = '\0';
    acStack_160[5] = '\0';
    acStack_160[6] = '\0';
    acStack_160[7] = '\0';
    error_impl("primitive",0x247,"unknown primitive %d!",(ulong)(uint)primitiveNumber);
    break;
  case 0x32:
    if ((*(ulong *)args[1].header & 2) == 0) {
      acStack_160[0] = '\x04';
      acStack_160[1] = -0x1a;
      acStack_160[2] = '\x10';
      acStack_160[3] = '\0';
      acStack_160[4] = '\0';
      acStack_160[5] = '\0';
      acStack_160[6] = '\0';
      acStack_160[7] = '\0';
      printf("#position: failed, first arg is not a binary object.\n");
      *failed = 1;
    }
    else if (((args[1].class)->header & 2) == 0) {
      acStack_160[0] = '6';
      acStack_160[1] = -0x1a;
      acStack_160[2] = '\x10';
      acStack_160[3] = '\0';
      acStack_160[4] = '\0';
      acStack_160[5] = '\0';
      acStack_160[6] = '\0';
      acStack_160[7] = '\0';
      printf("#position: failed, second arg is not a binary object.\n");
      *failed = 1;
    }
    else {
      uVar15 = *(ulong *)args[1].header >> 2;
      uVar8 = (uint)uVar15 & 0x3fffffff;
      uVar1 = (args[1].class)->header >> 2;
      uVar7 = (uint)uVar1 & 0x3fffffff;
      if ((((uVar15 & 0x3fffffff) == 0) || ((uVar1 & 0x3fffffff) == 0)) || (uVar8 < uVar7)) {
        _j = nilObject;
      }
      else {
        pcVar12 = acStack_160 + (8 - ((long)(int)uVar8 + 0x10U & 0xfffffffffffffff0));
        pcVar11 = pcVar12 + -((long)(int)uVar7 + 0x10U & 0xfffffffffffffff0);
        msg = (byteObject *)0x0;
        poVar14 = (object *)args[1].header;
        r = pcVar11;
        q = pcVar12;
        pcVar11[-8] = -0x1c;
        pcVar11[-7] = -0x1a;
        pcVar11[-6] = '\x10';
        pcVar11[-5] = '\0';
        pcVar11[-4] = '\0';
        pcVar11[-3] = '\0';
        pcVar11[-2] = '\0';
        pcVar11[-1] = '\0';
        getUnixString(pcVar12,uVar8 + 1,poVar14);
        pcVar12 = r;
        poVar14 = args[1].class;
        pcVar11[-8] = -2;
        pcVar11[-7] = -0x1a;
        pcVar11[-6] = '\x10';
        pcVar11[-5] = '\0';
        pcVar11[-4] = '\0';
        pcVar11[-3] = '\0';
        pcVar11[-2] = '\0';
        pcVar11[-1] = '\0';
        getUnixString(pcVar12,uVar7 + 1,poVar14);
        pcVar3 = q;
        pcVar12 = r;
        pcVar11[-8] = '\x11';
        pcVar11[-7] = -0x19;
        pcVar11[-6] = '\x10';
        pcVar11[-5] = '\0';
        pcVar11[-4] = '\0';
        pcVar11[-3] = '\0';
        pcVar11[-2] = '\0';
        pcVar11[-1] = '\0';
        pcVar12 = strstr(pcVar3,pcVar12);
        if (pcVar12 == (char *)0x0) {
          _j = nilObject;
        }
        else {
          _j = (object *)((long)(pcVar12 + (1 - (long)q)) * 2 | 1);
        }
      }
    }
    break;
  case 0x33:
    acStack_160[0] = -0x56;
    acStack_160[1] = -0x19;
    acStack_160[2] = '\x10';
    acStack_160[3] = '\0';
    acStack_160[4] = '\0';
    acStack_160[5] = '\0';
    acStack_160[6] = '\0';
    acStack_160[7] = '\0';
    _j = stringToUrl((byteObject *)args[1].header);
    break;
  case 0x34:
    acStack_160[0] = -0x40;
    acStack_160[1] = -0x19;
    acStack_160[2] = '\x10';
    acStack_160[3] = '\0';
    acStack_160[4] = '\0';
    acStack_160[5] = '\0';
    acStack_160[6] = '\0';
    acStack_160[7] = '\0';
    _j = urlToString((byteObject *)args[1].header);
    break;
  case 0x3c:
    argv_array = (object *)args[1].header;
    acStack_160[0] = '\0';
    acStack_160[1] = -0x18;
    acStack_160[2] = '\x10';
    acStack_160[3] = '\0';
    acStack_160[4] = '\0';
    acStack_160[5] = '\0';
    acStack_160[6] = '\0';
    acStack_160[7] = '\0';
    printf("Log: %.*s\n",argv_array->header >> 2 & 0x3fffffff,argv_array + 1);
    *failed = 0;
    _j = nilObject;
    break;
  case 0x3d:
    acStack_160[0] = '$';
    acStack_160[1] = -0x18;
    acStack_160[2] = '\x10';
    acStack_160[3] = '\0';
    acStack_160[4] = '\0';
    acStack_160[5] = '\0';
    acStack_160[6] = '\0';
    acStack_160[7] = '\0';
    val = time_usec();
    acStack_160[0] = ',';
    acStack_160[1] = -0x18;
    acStack_160[2] = '\x10';
    acStack_160[3] = '\0';
    acStack_160[4] = '\0';
    acStack_160[5] = '\0';
    acStack_160[6] = '\0';
    acStack_160[7] = '\0';
    _j = newLInteger(val);
    *failed = 0;
    break;
  case 0x46:
    poStack_110 = (object *)0x0;
    memoryPointer = (object *)((long)&memoryPointer->header + (long)((prog_argc + 2) * -8));
    if ((long)memoryPointer < (long)memoryBase) {
      acStack_160[0] = -0x6c;
      acStack_160[1] = -0x18;
      acStack_160[2] = '\x10';
      acStack_160[3] = '\0';
      acStack_160[4] = '\0';
      acStack_160[5] = '\0';
      acStack_160[6] = '\0';
      acStack_160[7] = '\0';
      local_148 = gcollect(prog_argc);
    }
    else {
      memoryPointer->header = (ulong)(uint)(prog_argc << 2);
      local_148 = memoryPointer;
    }
    poStack_110 = local_148;
    local_148->class = ArrayClass;
    lVar18 = (long)rootTop;
    rootTop = rootTop + 1;
    rootStack[lVar18] = local_148;
    for (argv_entry._4_4_ = 0; argv_entry._4_4_ < prog_argc; argv_entry._4_4_ = argv_entry._4_4_ + 1
        ) {
      argv_str = (char *)0x0;
      _i_1 = prog_argv[argv_entry._4_4_];
      acStack_160[0] = 'l';
      acStack_160[1] = -0x17;
      acStack_160[2] = '\x10';
      acStack_160[3] = '\0';
      acStack_160[4] = '\0';
      acStack_160[5] = '\0';
      acStack_160[6] = '\0';
      acStack_160[7] = '\0';
      sVar13 = strlen(_i_1);
      local_12c = (int)sVar13;
      acStack_160[0] = '}';
      acStack_160[1] = -0x17;
      acStack_160[2] = '\x10';
      acStack_160[3] = '\0';
      acStack_160[4] = '\0';
      acStack_160[5] = '\0';
      acStack_160[6] = '\0';
      acStack_160[7] = '\0';
      poVar14 = gcialloc(local_12c);
      poVar14->class = StringClass;
      for (local_130 = 0; local_130 < local_12c; local_130 = local_130 + 1) {
        *(char *)((long)&poVar14[1].header + (long)local_130) = _i_1[local_130];
      }
      poStack_110 = rootStack[rootTop + -1];
      (&poStack_110[1].header)[argv_entry._4_4_] = (uintptr_t)poVar14;
    }
    rootTop = rootTop + -1;
    _j = rootStack[rootTop];
    *failed = 0;
    break;
  case 100:
    uVar15 = args[1].header >> 1;
    local_150 = uVar15 & 0xffffffff;
    switch(local_150) {
    case 0:
      acStack_160[0] = -0x3e;
      acStack_160[1] = -0x16;
      acStack_160[2] = '\x10';
      acStack_160[3] = '\0';
      acStack_160[4] = '\0';
      acStack_160[5] = '\0';
      acStack_160[6] = '\0';
      acStack_160[7] = '\0';
      port = socket(2,1,0);
      if (port == -1) {
        acStack_160[0] = -0x15;
        acStack_160[1] = -0x16;
        acStack_160[2] = '\x10';
        acStack_160[3] = '\0';
        acStack_160[4] = '\0';
        acStack_160[5] = '\0';
        acStack_160[6] = '\0';
        acStack_160[7] = '\0';
        error_impl("primitive",0x1be,"Cannot open TCP socket.");
      }
      local_98 = 1;
      acStack_160[0] = '\x17';
      acStack_160[1] = -0x15;
      acStack_160[2] = '\x10';
      acStack_160[3] = '\0';
      acStack_160[4] = '\0';
      acStack_160[5] = '\0';
      acStack_160[6] = '\0';
      acStack_160[7] = '\0';
      iVar6 = setsockopt(port,1,2,&local_98,4);
      if (iVar6 != 0) {
        acStack_160[0] = '\'';
        acStack_160[1] = -0x15;
        acStack_160[2] = '\x10';
        acStack_160[3] = '\0';
        acStack_160[4] = '\0';
        acStack_160[5] = '\0';
        acStack_160[6] = '\0';
        acStack_160[7] = '\0';
        close(port);
        acStack_160[0] = 'A';
        acStack_160[1] = -0x15;
        acStack_160[2] = '\x10';
        acStack_160[3] = '\0';
        acStack_160[4] = '\0';
        acStack_160[5] = '\0';
        acStack_160[6] = '\0';
        acStack_160[7] = '\0';
        error_impl("primitive",0x1c5,"Error setting socket reuse option!");
      }
      acStack_160[0] = 'a';
      acStack_160[1] = -0x15;
      acStack_160[2] = '\x10';
      acStack_160[3] = '\0';
      acStack_160[4] = '\0';
      acStack_160[5] = '\0';
      acStack_160[6] = '\0';
      acStack_160[7] = '\0';
      info_impl("primitive",0x1ca,"opened socket %d.",(ulong)(uint)port);
      _j = (object *)((long)port << 1 | 1);
      break;
    case 1:
      port = (int)((long)args[1].class >> 1);
      acStack_160[0] = -0x67;
      acStack_160[1] = -0x15;
      acStack_160[2] = '\x10';
      acStack_160[3] = '\0';
      acStack_160[4] = '\0';
      acStack_160[5] = '\0';
      acStack_160[6] = '\0';
      acStack_160[7] = '\0';
      iVar6 = listen(port,10);
      if (iVar6 == -1) {
        acStack_160[0] = -0x48;
        acStack_160[1] = -0x15;
        acStack_160[2] = '\x10';
        acStack_160[3] = '\0';
        acStack_160[4] = '\0';
        acStack_160[5] = '\0';
        acStack_160[6] = '\0';
        acStack_160[7] = '\0';
        error_impl("primitive",0x1d4,"Error listening on TCP socket.");
      }
      sock_opt = 0x10;
      acStack_160[0] = -0x28;
      acStack_160[1] = -0x15;
      acStack_160[2] = '\x10';
      acStack_160[3] = '\0';
      acStack_160[4] = '\0';
      acStack_160[5] = '\0';
      acStack_160[6] = '\0';
      acStack_160[7] = '\0';
      port = accept(port,(sockaddr *)sin.sin_zero,(socklen_t *)&sock_opt);
      if (port == -1) {
        acStack_160[0] = -0x14;
        acStack_160[1] = -0x15;
        acStack_160[2] = '\x10';
        acStack_160[3] = '\0';
        acStack_160[4] = '\0';
        acStack_160[5] = '\0';
        acStack_160[6] = '\0';
        acStack_160[7] = '\0';
        puVar9 = (uint *)__errno_location();
        acStack_160[0] = '\b';
        acStack_160[1] = -0x14;
        acStack_160[2] = '\x10';
        acStack_160[3] = '\0';
        acStack_160[4] = '\0';
        acStack_160[5] = '\0';
        acStack_160[6] = '\0';
        acStack_160[7] = '\0';
        error_impl("primitive",0x1de,"Error accepting on TCP socket.  Errno=%d",(ulong)*puVar9);
      }
      _j = (object *)((long)port << 1 | 1);
      break;
    case 2:
      uVar15 = (long)args[1].class >> 1;
      port = (int)uVar15;
      acStack_160[0] = 'P';
      acStack_160[1] = -0x14;
      acStack_160[2] = '\x10';
      acStack_160[3] = '\0';
      acStack_160[4] = '\0';
      acStack_160[5] = '\0';
      acStack_160[6] = '\0';
      acStack_160[7] = '\0';
      info_impl("primitive",0x1e8,"closing socket %d.",uVar15 & 0xffffffff);
      acStack_160[0] = '[';
      acStack_160[1] = -0x14;
      acStack_160[2] = '\x10';
      acStack_160[3] = '\0';
      acStack_160[4] = '\0';
      acStack_160[5] = '\0';
      acStack_160[6] = '\0';
      acStack_160[7] = '\0';
      close(port);
      _j = trueObject;
      break;
    case 3:
      port = (int)((long)args[1].class >> 1);
      acStack_160[0] = -0x6b;
      acStack_160[1] = -0x14;
      acStack_160[2] = '\x10';
      acStack_160[3] = '\0';
      acStack_160[4] = '\0';
      acStack_160[5] = '\0';
      acStack_160[6] = '\0';
      acStack_160[7] = '\0';
      getUnixString(myAddr.sa_data + 6,0x11,(object *)args[2].header);
      ba._4_4_ = (uint)((long)args[2].class >> 1);
      acStack_160[0] = -0x3a;
      acStack_160[1] = -0x14;
      acStack_160[2] = '\x10';
      acStack_160[3] = '\0';
      acStack_160[4] = '\0';
      acStack_160[5] = '\0';
      acStack_160[6] = '\0';
      acStack_160[7] = '\0';
      info_impl("primitive",0x1f8,"Socket: %d",(ulong)(uint)port);
      acStack_160[0] = -0x1c;
      acStack_160[1] = -0x14;
      acStack_160[2] = '\x10';
      acStack_160[3] = '\0';
      acStack_160[4] = '\0';
      acStack_160[5] = '\0';
      acStack_160[6] = '\0';
      acStack_160[7] = '\0';
      info_impl("primitive",0x1f9,"IP: %s",myAddr.sa_data + 6);
      acStack_160[0] = '\x04';
      acStack_160[1] = -0x13;
      acStack_160[2] = '\x10';
      acStack_160[3] = '\0';
      acStack_160[4] = '\0';
      acStack_160[5] = '\0';
      acStack_160[6] = '\0';
      acStack_160[7] = '\0';
      info_impl("primitive",0x1fa,"Port: %d",(ulong)ba._4_4_);
      acStack_160[0] = '\x14';
      acStack_160[1] = -0x13;
      acStack_160[2] = '\x10';
      acStack_160[3] = '\0';
      acStack_160[4] = '\0';
      acStack_160[5] = '\0';
      acStack_160[6] = '\0';
      acStack_160[7] = '\0';
      iVar6 = inet_aton(myAddr.sa_data + 6,(in_addr *)&sock);
      if (iVar6 == 0) {
        acStack_160[0] = '3';
        acStack_160[1] = -0x13;
        acStack_160[2] = '\x10';
        acStack_160[3] = '\0';
        acStack_160[4] = '\0';
        acStack_160[5] = '\0';
        acStack_160[6] = '\0';
        acStack_160[7] = '\0';
        error_impl("primitive",0x1fe,"Illegal address passed to bind primitive.");
      }
      myAddrSize._0_2_ = 2;
      acStack_160[0] = 'G';
      acStack_160[1] = -0x13;
      acStack_160[2] = '\x10';
      acStack_160[3] = '\0';
      acStack_160[4] = '\0';
      acStack_160[5] = '\0';
      acStack_160[6] = '\0';
      acStack_160[7] = '\0';
      myAddrSize._2_2_ = htons((uint16_t)ba._4_4_);
      iaddr.s_addr = sock;
      acStack_160[0] = 'h';
      acStack_160[1] = -0x13;
      acStack_160[2] = '\x10';
      acStack_160[3] = '\0';
      acStack_160[4] = '\0';
      acStack_160[5] = '\0';
      acStack_160[6] = '\0';
      acStack_160[7] = '\0';
      iVar6 = bind(port,(sockaddr *)&myAddrSize,0x10);
      if (iVar6 == -1) {
        acStack_160[0] = -0x79;
        acStack_160[1] = -0x13;
        acStack_160[2] = '\x10';
        acStack_160[3] = '\0';
        acStack_160[4] = '\0';
        acStack_160[5] = '\0';
        acStack_160[6] = '\0';
        acStack_160[7] = '\0';
        error_impl("primitive",0x208,"Cannot bind TCP socket to address.");
      }
      _j = trueObject;
      break;
    default:
      acStack_160[0] = '@';
      acStack_160[1] = -0x11;
      acStack_160[2] = '\x10';
      acStack_160[3] = '\0';
      acStack_160[4] = '\0';
      acStack_160[5] = '\0';
      acStack_160[6] = '\0';
      acStack_160[7] = '\0';
      error_impl("primitive",0x240,"Unknown socket primitive operation: %d!",uVar15 & 0xffffffff);
      break;
    case 7:
      port = (int)((long)args[1].class >> 1);
      for (rc = 0; rc < 0x400; rc = rc + 1) {
        socketReadBuffer[rc] = '\0';
      }
      acStack_160[0] = -0x14;
      acStack_160[1] = -0x13;
      acStack_160[2] = '\x10';
      acStack_160[3] = '\0';
      acStack_160[4] = '\0';
      acStack_160[5] = '\0';
      acStack_160[6] = '\0';
      acStack_160[7] = '\0';
      sVar17 = read(port,socketReadBuffer,0x400);
      uVar8 = (uint)sVar17;
      if ((int)uVar8 < 0) {
        acStack_160[0] = -6;
        acStack_160[1] = -0x13;
        acStack_160[2] = '\x10';
        acStack_160[3] = '\0';
        acStack_160[4] = '\0';
        acStack_160[5] = '\0';
        acStack_160[6] = '\0';
        acStack_160[7] = '\0';
        piVar16 = __errno_location();
        if (*piVar16 != 0xb) {
          acStack_160[0] = '\x04';
          acStack_160[1] = -0x12;
          acStack_160[2] = '\x10';
          acStack_160[3] = '\0';
          acStack_160[4] = '\0';
          acStack_160[5] = '\0';
          acStack_160[6] = '\0';
          acStack_160[7] = '\0';
          piVar16 = __errno_location();
          if (*piVar16 != 0xb) {
            acStack_160[0] = '\x17';
            acStack_160[1] = -0x12;
            acStack_160[2] = '\x10';
            acStack_160[3] = '\0';
            acStack_160[4] = '\0';
            acStack_160[5] = '\0';
            acStack_160[6] = '\0';
            acStack_160[7] = '\0';
            local_154 = uVar8;
            puVar9 = (uint *)__errno_location();
            acStack_160[0] = ':';
            acStack_160[1] = -0x12;
            acStack_160[2] = '\x10';
            acStack_160[3] = '\0';
            acStack_160[4] = '\0';
            acStack_160[5] = '\0';
            acStack_160[6] = '\0';
            acStack_160[7] = '\0';
            info_impl("primitive",0x218,"socket read returned an error: %d (%d)!",(ulong)local_154,
                      (ulong)*puVar9);
            *failed = 1;
            return poVar14;
          }
        }
      }
      acStack_160[0] = 'Q';
      acStack_160[1] = -0x12;
      acStack_160[2] = '\x10';
      acStack_160[3] = '\0';
      acStack_160[4] = '\0';
      acStack_160[5] = '\0';
      acStack_160[6] = '\0';
      acStack_160[7] = '\0';
      _j = gcialloc(uVar8);
      _j->class = ByteArrayClass;
      for (local_30 = 0; local_30 < (int)uVar8; local_30 = local_30 + 1) {
        *(uint8_t *)((long)&_j[1].header + (long)local_30) = socketReadBuffer[local_30];
      }
      break;
    case 8:
      port = (int)((long)args[1].class >> 1);
      acStack_160[0] = -7;
      acStack_160[1] = -0x12;
      acStack_160[2] = '\x10';
      acStack_160[3] = '\0';
      acStack_160[4] = '\0';
      acStack_160[5] = '\0';
      acStack_160[6] = '\0';
      acStack_160[7] = '\0';
      sVar17 = write(port,(void *)(args[2].header + 0x10),
                     (long)(int)((uint)(*(ulong *)args[2].header >> 2) & 0x3fffffff));
      if ((int)sVar17 < 1) {
        _j = nilObject;
      }
      else {
        _j = (object *)((long)(int)sVar17 << 1 | 1);
      }
    }
  }
  return _j;
}

Assistant:

struct object *primitive(int primitiveNumber, struct object *args, int *failed)
{
    struct object *returnedValue = nilObject;
    int i, j;
    int rc;
    FILE *fp;
    uint8_t *p;
    struct byteObject *stringReturn;
    //char nameBuffer[80], modeBuffer[80];
    int subPrim=0;
    char netBuffer[18];
    struct sockaddr myAddr;
    struct sockaddr_in sin;
    struct in_addr iaddr;
    socklen_t myAddrSize;
    int sock;
    int sock_opt;
    int port;
    struct byteObject *ba;


    *failed = 0;
    switch(primitiveNumber) {
    case 100:
    {
        /* open a file */
        int pathSize = SIZE(args->data[0]) + 1;
        char *pathBuffer = (char *)alloca((size_t)pathSize);
        int modeSize = SIZE(args->data[1]) + 1;
        char *modeBuffer = (char *)alloca((size_t)modeSize);

        getUnixString(pathBuffer, pathSize, args->data[0]);
        getUnixString(modeBuffer, modeSize, args->data[1]);

        fp = fopen(pathBuffer, modeBuffer);
        if (fp != NULL) {
            for (i = 0; i < FILEMAX; ++i) {
                if (filePointers[i] == NULL) {
                    break;
                }
            }
            if (i >= FILEMAX) {
                error("too many open files");
            } else {
                returnedValue = newInteger(i);
                filePointers[i] = fp;
            }
        } else {
            *failed = 1;
        }
    }

    break;

    case 101:	/* read a single character from a file */
        i = integerValue(args->data[0]);
        if ((i < 0) || (i >= FILEMAX) || !(fp = filePointers[i])) {
            *failed = 1;
            break;
        }
        i = fgetc(fp);
        if (i != EOF) {
            returnedValue = newInteger(i);
        }
        break;

    case 102:	/* write a single character to a file */
        i = integerValue(args->data[0]);
        if ((i < 0) || (i >= FILEMAX) || !(fp = filePointers[i])) {
            *failed = 1;
            break;
        }
        fputc(integerValue(args->data[1]), fp);
        break;

    case 103:	/* close file */
        i = integerValue(args->data[0]);
        if ((i < 0) || (i >= FILEMAX) || !(fp = filePointers[i])) {
            *failed = 1;
            break;
        }
        fclose(fp);
        break;

    case 104:	/* file out image */
        i = integerValue(args->data[0]);
        if ((i < 0) || (i >= FILEMAX) || !(fp = filePointers[i])) {
            *failed = 1;
            break;
        }
        fileOut(fp);
        break;

    case 105:
    {
        /* edit a string */
        char *tmpFileName = NULL;
        size_t tmpFileNameSize = 0;

        /* first get the size needed for the temporary path */
        tmpFileNameSize = (size_t)snprintf(tmpFileName, 0, "%s/lsteditXXXXXX", tmpdir) + 1;

        info("temporary file name size is %d", (int)tmpFileNameSize);

        /* allocate it on the stack and write the string into it. */
        tmpFileName = (char *)alloca((size_t)tmpFileNameSize + 1);
        memset(tmpFileName, 0, tmpFileNameSize + 1);
        snprintf(tmpFileName, tmpFileNameSize + 1, "%s/lsteditXXXXXX", tmpdir);

        info("DEBUG: temp file name pattern: %s",tmpFileName);

        rc = mkstemp(tmpFileName);
        /* copy string to file */
        if(rc == -1) {
            error("error making temporary file name: errno=%d!", errno);
        }

        fp = fopen(tmpFileName, "w");
        if (fp == NULL) {
            error("cannot open temp edit file %s!", tmpFileName);
        }

        j = SIZE(args->data[0]);
        p = ((struct byteObject *) args->data[0])->bytes;

        for (i = 0; i < j; i++) {
            fputc(*p++, fp);
        }
        fputc('\n', fp);

        fclose(fp);

        /* call the editor */
        size_t cmdBufSize = tmpFileNameSize + strlen("vi ");
        char *cmdBuf = (char*)alloca(cmdBufSize + 1);
        memset(cmdBuf, 0, cmdBufSize + 1);

        strcpy(cmdBuf,"vi ");
        strcat(cmdBuf, tmpFileName);
        rc = system(cmdBuf);

        if(rc == -1) {
            error("error starting editor: %d!",(int)errno);
        }

        /* copy back to new string */
        fp = fopen(tmpFileName, "r");
        if (fp == NULL) {
            error("cannot open temp edit file %s!", tmpFileName);
        }

        /* get length of file */
        fseek(fp, 0, 2);
        j = (int) ftell(fp);

        returnedValue = (struct object *)(stringReturn = (struct byteObject *)gcialloc(j));
        returnedValue->class = args->data[0]->class;

        /* reset to beginning, and read values */
        fseek(fp, 0, 0);

        /* FIXME - check for EOF! */
        for (i = 0; i < j; i++) {
            stringReturn->bytes[i] = (uint8_t)fgetc(fp);
        }
        /* now clean up files */
        fclose(fp);
        unlink(tmpFileName);
    }

    break;

    case 106:	/* Read into ByteArray */
        /* File descriptor */
        i = integerValue(args->data[0]);
        if ((i < 0) || (i >= FILEMAX) || !(fp = filePointers[i])) {
            *failed = 1;
            break;
        }

        /* Make sure we're populating an array of bytes */
        returnedValue = args->data[1];
        if (!IS_BINOBJ(returnedValue)) {
            *failed = 1;
            break;
        }

        /* Sanity check on I/O count */
        i = integerValue(args->data[2]);
        if ((i < 0) || (i > (int)SIZE(returnedValue))) {
            *failed = 1;
            break;
        }

        /* Do the I/O */
        i = (int)fread(bytePtr(returnedValue), sizeof(char), (size_t)i, fp);
        if (i < 0) {
            *failed = 1;
            break;
        }
        returnedValue = newInteger(i);
        break;

    case 107:	/* Write from ByteArray */
        /* File descriptor */
        i = integerValue(args->data[0]);
        if ((i < 0) || (i >= FILEMAX) || !(fp = filePointers[i])) {
            *failed = 1;
            break;
        }

        /* Make sure we're writing an array of bytes */
        returnedValue = args->data[1];
        if (!IS_BINOBJ(returnedValue)) {
            *failed = 1;
            break;
        }

        /* Sanity check on I/O count */
        i = integerValue(args->data[2]);
        if ((i < 0) || (i > (int)SIZE(returnedValue))) {
            *failed = 1;
            break;
        }

        /* Do the I/O */
        i = (int)fwrite(bytePtr(returnedValue), sizeof(char), (size_t)i, fp);
        if (i < 0) {
            *failed = 1;
            break;
        }
        returnedValue = newInteger(i);
        break;

    case 108:	/* Seek to file position */
        /* File descriptor */
        i = integerValue(args->data[0]);
        if ((i < 0) || (i >= FILEMAX) || !(fp = filePointers[i])) {
            *failed = 1;
            break;
        }

        /* File position */
        i = integerValue(args->data[1]);
        if ((i < 0) || ((i = fseek(fp, i, SEEK_SET)) < 0)) {
            *failed = 1;
            break;
        }

        /* Return position as our value */
        returnedValue = newInteger(i);
        break;


    case 150:	/* match substring in a string. Return index of substring or fail. */
        /* make sure we've got strings */
        if(!IS_BINOBJ(args->data[0])) {
            printf("#position: failed, first arg is not a binary object.\n");
            *failed = 1;
            break;
        }

        if(!IS_BINOBJ(args->data[1])) {
            printf("#position: failed, second arg is not a binary object.\n");
            *failed = 1;
            break;
        }

        /* get the sizes of the strings */
        i = SIZE(args->data[0]);
        j = SIZE(args->data[1]);

        /*
         * don't bother to compare if either string has a zero length
         * or the second string is longer than the first
         */

        if((i > 0) && (j > 0) && (i>=j)) {
            /* using alloca to make sure that the memory is freed automatically */
            char *p = (char *)alloca((size_t)i+1);
            char *q = (char *)alloca((size_t)j+1);
            char *r = (char *)0;

            getUnixString(p,i+1,args->data[0]);
            getUnixString(q,j+1,args->data[1]);

            /* find the pointer to the substring */
            r = strstr(p,q);

            if(r != NULL) {
                /* the string was found */
                returnedValue = newInteger((r-p)+1);
            } else {
                returnedValue = nilObject;
            }

            /* success */
            break;
        } else {
            if((i<0) || (j<0)) {
                printf("#position: failed due to unusable string sizes, string 1 size %d, string 2 size %d.\n", i, j);
            } else {
                /* i==0 or j==0 or i<j in which case we have no match but no error. */
                returnedValue = nilObject;
                break;
            }
        }

        /* if we get here, we've failed */
        *failed = 1;
        break;

    case 151: /* convert a string to URL encoding, returns nil or string */
        returnedValue = stringToUrl((struct byteObject *)args->data[0]);

        break;


    case 152: /* convert a string from URL encoding, returns nil or string */
        returnedValue = urlToString((struct byteObject *)args->data[0]);

        break;

    /* large timestamps */
    case 160: /* print out a microsecond timestamp and message string. */
        {
            struct byteObject *msg = (struct byteObject *)(args->data[0]);

            printf("Log: %.*s\n", SIZE(msg), bytePtr(msg));

            *failed = 0;

            returnedValue = nilObject;
        }

        break;

    case 161: /* return an Integer with the microsecond timestamp. */
        returnedValue = newLInteger(time_usec());
        *failed = 0;
        break;

    case 170: /* get argv strings as an Array of Strings. */
        {
            struct object *argv_array = NULL;

            /* allocate enough space for the result Array. */
            argv_array = gcalloc(prog_argc);
            argv_array->class = ArrayClass;

            /* we are going to allocate Strings and that could cause GC. */
            PUSH_ROOT(argv_array);

            for(int index = 0; index < prog_argc; index++) {
                struct object *argv_entry = NULL;
                const char *argv_str = prog_argv[index];
                int str_len = (int)strlen(argv_str);

                /* could cause GC */
                argv_entry = gcialloc(str_len);
                argv_entry->class = StringClass;

                /* copy the bytes. */
                for(int i=0; i < str_len; i++) {
                    bytePtr(argv_entry)[i] = (uint8_t)argv_str[i];
                }

                /* get the pointer to the array again.   Could have changed due to GC. */
                argv_array = PEEK_ROOT();

                argv_array->data[index] = argv_entry;
            }

            argv_array = POP_ROOT();

            returnedValue = argv_array;

            *failed = 0;
        }

        break;

    case 200: /* this is a set of primitives for socket handling */
        subPrim = integerValue(args->data[0]);

        /* 200-250 socket handling */
        switch(subPrim) {
        case 0: /* open a TCP socket */
            sock = socket(PF_INET,SOCK_STREAM,0);

            if(sock == -1) {
                error("Cannot open TCP socket.");
            }

            sock_opt = 1;

            if(setsockopt(sock, SOL_SOCKET, SO_REUSEADDR, (char*)&sock_opt, sizeof(sock_opt))) {
                close(sock);
                error("Error setting socket reuse option!");
            }

            /* return the value anyway */

            info("opened socket %d.", sock);

            returnedValue = newInteger(sock);

            break;

        case 1: /* accept on a socket */
            sock = integerValue(args->data[1]);

            if(listen(sock, 10) == -1) {
                error("Error listening on TCP socket.");
            }

            /* set the maximum size */
            myAddrSize = sizeof(myAddr);

            /* printf("accept(%d, %p, %d)\n", sock, &myAddr, myAddrSize); */

            sock = accept(sock, &myAddr, &myAddrSize);
            if(sock == -1) {
                error("Error accepting on TCP socket.  Errno=%d", errno);
            }

            returnedValue = newInteger(sock);

            break;

        case 2: /* close a socket */
            sock = integerValue(args->data[1]);

            info("closing socket %d.", sock);

            close(sock);

            returnedValue = trueObject;

            break;

        case 3: /* bind a socket to an address and port */
            /* this takes three arguments, the socket fd,
            the address (as a dotted-notation string) and
            the port as an integer */
            sock = integerValue(args->data[1]);
            getUnixString(netBuffer, sizeof(netBuffer)-1, args->data[2]);
            port = integerValue(args->data[3]);

            info("Socket: %d",sock);
            info("IP: %s",netBuffer);
            info("Port: %d",port);

            /* convert the string IP to a network representation */
            if(inet_aton((const char *)netBuffer,&iaddr) == 0) {
                error("Illegal address passed to bind primitive.");
            }

            /* build a sockaddr_in struct */
            sin.sin_family = AF_INET;
            sin.sin_port = htons((u_int16_t)port);
            /*			sin.sin_port = (u_int16_t)0;*/
            sin.sin_addr = iaddr;

            if(bind(sock,(struct sockaddr *)&sin,sizeof(sin)) == -1) {
                error("Cannot bind TCP socket to address.");
            }

            returnedValue = trueObject;

            break;

        case 7: /* read from a TCP socket.  This returns a byte array. */
            sock = integerValue(args->data[1]);

            for(i=0; i<SOCK_BUF_SIZE; i++) {
                socketReadBuffer[i]=(char)0;
            }

            i = (int)read(sock,(void *)socketReadBuffer,(size_t)SOCK_BUF_SIZE);
            if((i < 0) && (errno != EAGAIN) && (errno != EWOULDBLOCK)) {
                info("socket read returned an error: %d (%d)!", i, errno);
                *failed = 1;
                break;
            }

//            printf("Read: %s\n",socketReadBuffer);

            ba = (struct byteObject *)gcialloc(i);
            ba->class = ByteArrayClass;

            /* copy data into the new ByteArray */
            for(j=0; j<i; j++) {
                bytePtr(ba)[j] = socketReadBuffer[j];
            }

            returnedValue = (struct object *)ba;

            break;

        case 8: /* write to a socket, args: sock, data */
            sock = integerValue(args->data[1]);
            p = (uint8_t *)bytePtr(args->data[2]);
            i = SIZE(args->data[2]);

            /*printf("Writing: ");
            snprintf(socketReadBuffer,i,"%s",p);
            socketReadBuffer[i] = (char)0;
            printf("%s\n",socketReadBuffer);
            */

            j = (int)write(sock,(void *)p,(size_t)i);

            if(j>0)
                returnedValue = newInteger(j);
            else
                returnedValue = nilObject;

            break;

        default: /* unknown socket primitive */
            error("Unknown socket primitive operation: %d!",subPrim);
            break;
        }

        break;

    default:
        error("unknown primitive %d!", primitiveNumber);
    }
    return(returnedValue);
}